

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PelcoD.cpp
# Opt level: O2

void __thiscall
PelcoD::moveTopOnce(PelcoD *this,int panSpeed,int tiltSpeed,
                   vector<char,_std::allocator<char>_> *mess)

{
  allocator_type local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_38,9,&local_39);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(mess,&local_38);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  *(mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = -0x7f;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [1] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [2] = '\x06';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [3] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [4] = (char)(panSpeed % 0xff);
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [5] = (char)((long)tiltSpeed % 0xff);
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [6] = '\x03';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [7] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [8] = -1;
  return;
}

Assistant:

void PelcoD::moveTopOnce(int panSpeed, int tiltSpeed, std::vector<char> &mess)
{
	mess = std::vector<char>(9);
	mess[0] = 0x81;
	mess[1] = 0x01;
	mess[2] = 0x06;
	mess[3] = 0x01;
	mess[4] = panSpeed % 255;
	mess[5] = tiltSpeed % 255;
	mess[6] = 0x03;
	mess[7] = 0x01;
	mess[8] = 0xff;
}